

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O1

void __thiscall
kj::StringTree::visit<kj::_::(anonymous_namespace)::TestCase29::run()::__0&>
          (StringTree *this,anon_class_8_1_6ec8c47f *func)

{
  size_t sVar1;
  Branch *pBVar2;
  unsigned_long uVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  StringTree *this_00;
  uint local_44;
  unsigned_long local_40;
  StringTree *local_38;
  
  sVar1 = (this->branches).size_;
  local_38 = this;
  if (sVar1 == 0) {
    uVar6 = 0;
  }
  else {
    pBVar2 = (this->branches).ptr;
    lVar5 = sVar1 << 6;
    uVar6 = 0;
    do {
      this_00 = &pBVar2->content;
      uVar3 = *(ulong *)((long)(this_00 + -1) + 0x30) - uVar6;
      if (uVar6 <= *(ulong *)((long)(this_00 + -1) + 0x30) && uVar3 != 0) {
        *func->pieceCount = *func->pieceCount + 1;
        if ((uVar3 != 3) && (_::Debug::minSeverity < 3)) {
          local_44 = 3;
          local_40 = uVar3;
          _::Debug::log<char_const(&)[39],unsigned_int,unsigned_long>
                    ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/string-tree-test.c++"
                     ,0x28,ERROR,"\"failed: expected \" \"(3u) == (part.size())\", 3u, part.size()",
                     (char (*) [39])"failed: expected (3u) == (part.size())",&local_44,&local_40);
        }
        uVar6 = *(ulong *)((long)(this_00 + -1) + 0x30);
      }
      visit<kj::_::(anonymous_namespace)::TestCase29::run()::__0&>(this_00,func);
      pBVar2 = (Branch *)(this_00 + 1);
      lVar5 = lVar5 + -0x40;
    } while (lVar5 != 0);
  }
  sVar1 = (local_38->text).content.size_;
  uVar4 = 0;
  if (sVar1 != 0) {
    uVar4 = sVar1 - 1;
  }
  local_40 = uVar4 - uVar6;
  if (((uVar6 <= uVar4 && local_40 != 0) &&
      (*func->pieceCount = *func->pieceCount + 1, local_40 != 3)) && (_::Debug::minSeverity < 3)) {
    local_44 = 3;
    _::Debug::log<char_const(&)[39],unsigned_int,unsigned_long>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/string-tree-test.c++"
               ,0x28,ERROR,"\"failed: expected \" \"(3u) == (part.size())\", 3u, part.size()",
               (char (*) [39])"failed: expected (3u) == (part.size())",&local_44,&local_40);
  }
  return;
}

Assistant:

void StringTree::visit(Func&& func) const {
  size_t pos = 0;
  for (auto& branch: branches) {
    if (branch.index > pos) {
      func(text.slice(pos, branch.index));
      pos = branch.index;
    }
    branch.content.visit(func);
  }
  if (text.size() > pos) {
    func(text.slice(pos, text.size()));
  }
}